

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O2

UpVal * luaF_findupval(lua_State *L,StkId level)

{
  UpVal *pUVar1;
  anon_union_16_2_5131162a_for_u *paVar2;
  
  paVar2 = (anon_union_16_2_5131162a_for_u *)&L->openupval;
  while ((pUVar1 = (paVar2->open).next, pUVar1 != (UpVal *)0x0 && (level <= pUVar1->v))) {
    if (pUVar1->v == level) {
      return pUVar1;
    }
    paVar2 = &pUVar1->u;
  }
  pUVar1 = (UpVal *)luaM_realloc_(L,(void *)0x0,0,0x20);
  pUVar1->refcount = 0;
  (pUVar1->u).open.next = (paVar2->open).next;
  (pUVar1->u).open.touched = 1;
  (paVar2->open).next = pUVar1;
  pUVar1->v = level;
  if (L->twups == L) {
    L->twups = L->l_G->twups;
    L->l_G->twups = L;
  }
  return pUVar1;
}

Assistant:

UpVal *luaF_findupval(lua_State *L, StkId level) {
    UpVal **pp = &L->openupval;
    UpVal *p;
    UpVal *uv;
    lua_assert(isintwups(L) || L->openupval == NULL);
    while (*pp != NULL && (p = *pp)->v >= level) {
        lua_assert(upisopen(p));
        if (p->v == level)  /* found a corresponding upvalue? */
            return p;  /* return it */
        pp = &p->u.open.next;
    }
    /* not found: create a new upvalue */
    uv = luaM_new(L, UpVal);
    uv->refcount = 0;
    uv->u.open.next = *pp;  /* link it to list of open upvalues */
    uv->u.open.touched = 1;
    *pp = uv;
    uv->v = level;  /* current value lives in the stack */
    if (!isintwups(L)) {  /* thread not in list of threads with upvalues? */
        L->twups = G(L)->twups;  /* link it to the list */
        G(L)->twups = L;
    }
    return uv;
}